

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateMutableCopy
          (ImmutableMessageGenerator *this,Printer *printer)

{
  string local_30;
  
  ClassNameResolver::GetJavaMutableClassName_abi_cxx11_
            (&local_30,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[13],std::__cxx11::string>
            (printer,
             "protected com.google.protobuf.MutableMessage\n    internalMutableDefault() {\n  return MutableDefaultLoader.get();\n}\n\nprivate static final class MutableDefaultLoader {\n  private static final java.lang.Object defaultOrRuntimeException;\n  static {\n    java.lang.Object local;\n    try {\n      local = internalMutableDefault(\"$mutable_name$\");\n    } catch (java.lang.RuntimeException e) {\n      local = e;\n    }\n    defaultOrRuntimeException = local;\n  }\n\n  private MutableDefaultLoader() {}\n\n  public static com.google.protobuf.MutableMessage get() {\n    if (defaultOrRuntimeException\n         instanceof java.lang.RuntimeException) {\n      throw (java.lang.RuntimeException) defaultOrRuntimeException;\n    }\n    return\n        (com.google.protobuf.MutableMessage) defaultOrRuntimeException;\n  }\n}\n"
             ,(char (*) [13])"mutable_name",&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateMutableCopy(io::Printer* printer) {
  printer->Print(
      "protected com.google.protobuf.MutableMessage\n"
      "    internalMutableDefault() {\n"
      "  return MutableDefaultLoader.get();\n"
      "}\n"
      "\n"
      "private static final class MutableDefaultLoader {\n"
      "  private static final java.lang.Object defaultOrRuntimeException;\n"
      "  static {\n"
      "    java.lang.Object local;\n"
      "    try {\n"
      "      local = internalMutableDefault(\"$mutable_name$\");\n"
      "    } catch (java.lang.RuntimeException e) {\n"
      "      local = e;\n"
      "    }\n"
      "    defaultOrRuntimeException = local;\n"
      "  }\n"
      "\n"
      "  private MutableDefaultLoader() {}\n"
      "\n"
      "  public static com.google.protobuf.MutableMessage get() {\n"
      "    if (defaultOrRuntimeException\n"
      "         instanceof java.lang.RuntimeException) {\n"
      "      throw (java.lang.RuntimeException) defaultOrRuntimeException;\n"
      "    }\n"
      "    return\n"
      "        (com.google.protobuf.MutableMessage) "
      "defaultOrRuntimeException;\n"
      "  }\n"
      "}\n",
      "mutable_name", name_resolver_->GetJavaMutableClassName(descriptor_));
}